

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O3

void __thiscall Assimp::Q3BSPFileImporter::Q3BSPFileImporter(Q3BSPFileImporter *this)

{
  _Rb_tree_header *p_Var1;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_008cee78;
  p_Var1 = &(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header;
  this->m_pCurrentMesh = (aiMesh *)0x0;
  this->m_pCurrentFace = (aiFace *)0x0;
  *(undefined8 *)&(this->m_MaterialLookupMap)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Q3BSPFileImporter::Q3BSPFileImporter()
: m_pCurrentMesh( nullptr )
, m_pCurrentFace(nullptr)
, m_MaterialLookupMap()
, mTextures() {
    // empty
}